

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  char cVar1;
  Message *this_00;
  size_t i;
  pointer pcVar2;
  undefined1 local_58 [8];
  string full_flag;
  char *flag_local;
  
  full_flag.field_2._8_8_ = this;
  Message::Message((Message *)&flag_local);
  std::operator<<((ostream *)(flag_local + 0x10),"gtest_");
  this_00 = Message::operator<<((Message *)&flag_local,(char **)((long)&full_flag.field_2 + 8));
  Message::GetString_abi_cxx11_((string *)local_58,this_00);
  if (flag_local != (char *)0x0) {
    (**(code **)(*(long *)flag_local + 8))();
  }
  Message::Message((Message *)&flag_local);
  for (pcVar2 = (pointer)0x0; pcVar2 != full_flag._M_dataplus._M_p; pcVar2 = pcVar2 + 1) {
    cVar1 = ToUpper(*(char *)((long)local_58 + (long)pcVar2));
    std::operator<<((ostream *)(flag_local + 0x10),cVar1);
  }
  StringStreamToString(__return_storage_ptr__,(stringstream *)flag_local);
  if (flag_local != (char *)0x0) {
    (**(code **)(*(long *)flag_local + 8))(flag_local);
  }
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}